

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-make.c
# Opt level: O0

void get_mon_num_prep(_func__Bool_monster_race_ptr *get_mon_num_hook)

{
  _Bool _Var1;
  alloc_entry *paVar2;
  alloc_entry *entry;
  wchar_t i;
  _func__Bool_monster_race_ptr *get_mon_num_hook_local;
  
  entry._4_4_ = 0;
  do {
    if (alloc_race_size <= entry._4_4_) {
      return;
    }
    paVar2 = alloc_race_table + entry._4_4_;
    if (get_mon_num_hook == (_func__Bool_monster_race_ptr *)0x0) {
LAB_001a3f85:
      paVar2->prob2 = paVar2->prob1;
    }
    else {
      _Var1 = (*get_mon_num_hook)(r_info + paVar2->index);
      if (_Var1) goto LAB_001a3f85;
      paVar2->prob2 = 0;
    }
    entry._4_4_ = entry._4_4_ + 1;
  } while( true );
}

Assistant:

void get_mon_num_prep(bool (*get_mon_num_hook)(struct monster_race *race))
{
	int i;

	/* Scan the allocation table */
	for (i = 0; i < alloc_race_size; i++) {
		alloc_entry *entry = &alloc_race_table[i];

		/* Check the restriction, if any */
		if (!get_mon_num_hook || (*get_mon_num_hook)(&r_info[entry->index])) {
			/* Accept this monster */
			entry->prob2 = entry->prob1;

		} else {
			/* Do not use this monster */
			entry->prob2 = 0;
		}
	}
}